

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

void flush_pending(z_streamp strm)

{
  ulg *puVar1;
  deflate_state *s;
  uint uVar2;
  ulong __n;
  
  s = strm->state;
  cm_zlib__tr_flush_bits(s);
  uVar2 = (uint)s->pending;
  if (strm->avail_out < uVar2) {
    uVar2 = strm->avail_out;
  }
  if (uVar2 != 0) {
    __n = (ulong)uVar2;
    memcpy(strm->next_out,s->pending_out,__n);
    strm->next_out = strm->next_out + __n;
    s->pending_out = s->pending_out + __n;
    strm->total_out = strm->total_out + __n;
    strm->avail_out = strm->avail_out - uVar2;
    puVar1 = &s->pending;
    *puVar1 = *puVar1 - __n;
    if (*puVar1 == 0) {
      s->pending_out = s->pending_buf;
    }
  }
  return;
}

Assistant:

local void flush_pending(z_streamp strm) {
    unsigned len;
    deflate_state *s = strm->state;

    _tr_flush_bits(s);
    len = s->pending;
    if (len > strm->avail_out) len = strm->avail_out;
    if (len == 0) return;

    zmemcpy(strm->next_out, s->pending_out, len);
    strm->next_out  += len;
    s->pending_out  += len;
    strm->total_out += len;
    strm->avail_out -= len;
    s->pending      -= len;
    if (s->pending == 0) {
        s->pending_out = s->pending_buf;
    }
}